

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

int __thiscall QAbstractSocket::close(QAbstractSocket *this,int __fd)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)&this->field_0x8;
  iVar2 = QIODevice::close();
  if (*(int *)(lVar1 + 0x260) != 0) {
    iVar2 = (**(code **)(*(long *)this + 0x100))(this);
    return iVar2;
  }
  return iVar2;
}

Assistant:

void QAbstractSocket::close()
{
    Q_D(QAbstractSocket);
#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::close()");
#endif
    QIODevice::close();
    if (d->state != UnconnectedState)
        disconnectFromHost();
}